

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_common.h
# Opt level: O0

void VP8LPrefixEncodeBits(int distance,int *code,int *extra_bits)

{
  VP8LPrefixCode VVar1;
  int *in_RDX;
  int *in_RSI;
  int in_EDI;
  VP8LPrefixCode prefix_code;
  undefined6 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe6;
  undefined1 in_stack_ffffffffffffffe7;
  
  if (in_EDI < 0x200) {
    VVar1 = kPrefixEncodeCode[in_EDI];
    *in_RSI = (int)VVar1.code;
    *in_RDX = (int)VVar1.extra_bits;
  }
  else {
    VP8LPrefixEncodeBitsNoLUT
              ((int)((ulong)in_RSI >> 0x20),in_RDX,
               (int *)CONCAT17(in_stack_ffffffffffffffe7,
                               CONCAT16(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0)));
  }
  return;
}

Assistant:

static WEBP_INLINE void VP8LPrefixEncodeBits(int distance, int* const code,
                                             int* const extra_bits) {
  if (distance < PREFIX_LOOKUP_IDX_MAX) {
    const VP8LPrefixCode prefix_code = kPrefixEncodeCode[distance];
    *code = prefix_code.code;
    *extra_bits = prefix_code.extra_bits;
  } else {
    VP8LPrefixEncodeBitsNoLUT(distance, code, extra_bits);
  }
}